

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O0

void __thiscall SSD1306::OledI2C::sendCommand(OledI2C *this,uint8_t command)

{
  int __fd;
  pointer __buf;
  size_type __n;
  ssize_t sVar1;
  undefined8 uVar2;
  uchar in_SIL;
  long in_RDI;
  string what;
  array<unsigned_char,_2UL> data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  string local_70 [12];
  int in_stack_ffffffffffffff9c;
  string local_50 [40];
  string *in_stack_ffffffffffffffd8;
  error_category *in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffec;
  undefined5 in_stack_fffffffffffffff0;
  uchar uVar3;
  uchar uVar4;
  
  uVar3 = '\0';
  uVar4 = in_SIL;
  __fd = FileDescriptor::fd((FileDescriptor *)(in_RDI + 0x10));
  __buf = std::array<unsigned_char,_2UL>::data((array<unsigned_char,_2UL> *)0x109951);
  __n = std::array<unsigned_char,_2UL>::size((array<unsigned_char,_2UL> *)&stack0xfffffffffffffff5);
  sVar1 = write(__fd,__buf,__n);
  if (sVar1 == -1) {
    std::__cxx11::to_string(in_stack_ffffffffffffff9c);
    std::operator+((char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::operator+(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_70);
    uVar2 = __cxa_allocate_exception(0x20);
    __errno_location();
    std::_V2::system_category();
    std::system_error::system_error
              ((system_error *)
               CONCAT17(uVar4,CONCAT16(in_SIL,CONCAT15(uVar3,in_stack_fffffffffffffff0))),
               in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  return;
}

Assistant:

void
SSD1306::OledI2C::sendCommand(
    uint8_t command) const
{
    std::array<uint8_t, 2> data{OLED_COMMAND, command};

    if (::write(fd_.fd(), data.data(), data.size()) == -1)
    {
        std::string what( "write " __FILE__ "("
                        + std::to_string(__LINE__)
                        + ")" );
        throw std::system_error(errno, std::system_category(), what);
    }
}